

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_BL(DisasContext_conflict1 *s,arg_i *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint32_t uVar1;
  TCGContext_conflict1 *tcg_ctx;
  arg_i *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_R[0xe],(uint)(s->base).pc_next | s->thumb);
  uVar1 = read_pc(s);
  gen_jmp(s,uVar1 + a->imm);
  return true;
}

Assistant:

static bool trans_BL(DisasContext *s, arg_i *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_R[14], s->base.pc_next | s->thumb);
    gen_jmp(s, read_pc(s) + a->imm);
    return true;
}